

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O1

bool __thiscall
IR::Instr::IterateArgInstrs<GlobOpt::OptStackArgLenAndConst(IR::Instr*,Value**)::__1>
          (Instr *this,anon_class_16_2_0086a1e4 callback)

{
  OpCode OVar1;
  Opnd *pOVar2;
  _func_int **pp_Var3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  ArgSlot AVar7;
  StackSym *pSVar8;
  undefined4 *puVar9;
  Instr **ppIVar10;
  Instr *pIVar11;
  Instr *pIVar12;
  
  pSVar8 = Opnd::GetStackSym(this->m_src2);
  if (((pSVar8->field_0x18 & 1) == 0) || ((pSVar8->field_5).m_instrDef == (Instr *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar5) {
LAB_0046f012:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  pIVar12 = (pSVar8->field_5).m_instrDef;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if ((pIVar12->m_src2 == (Opnd *)0x0) ||
       (OVar6 = Opnd::GetKind(pIVar12->m_src2), OVar6 != OpndKindSym)) {
LAB_0046eed4:
      pIVar11 = (Instr *)0x0;
    }
    else {
      pOVar2 = pIVar12->m_src2;
      OVar6 = Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0046f012;
        *puVar9 = 0;
      }
      pp_Var3 = pOVar2[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_0046f012;
        *puVar9 = 0;
      }
      if (((*(byte *)((long)pp_Var3 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var3 + 0x16) == 0)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar5) goto LAB_0046f012;
        *puVar9 = 0;
      }
      if ((*(byte *)((long)pp_Var3 + 0x1a) & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar5) goto LAB_0046f012;
        *puVar9 = 0;
      }
      if ((((((ulong)pp_Var3[3] & 1) == 0) || (pp_Var3[5] == (_func_int *)0x0)) &&
          (bVar5 = Func::IsInPhase(this->m_func,FGPeepsPhase), !bVar5)) &&
         (bVar5 = Func::IsInPhase(this->m_func,FGBuildPhase), !bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar5) goto LAB_0046f012;
        *puVar9 = 0;
      }
      if (((ulong)pp_Var3[3] & 1) == 0) goto LAB_0046eed4;
      pIVar11 = (Instr *)pp_Var3[5];
    }
    OVar1 = pIVar12->m_opcode;
    ppIVar10 = (Instr **)(ulong)OVar1;
    if (OVar1 != ArgOut_A_InlineSpecialized) {
      if (OVar1 == StartCall) {
        if (pIVar11 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          ppIVar10 = (Instr **)(ulong)bVar5;
          if (!bVar5) goto LAB_0046f012;
          *puVar9 = 0;
        }
        break;
      }
      pOVar2 = pIVar12->m_dst;
      OVar6 = Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0046f012;
        *puVar9 = 0;
      }
      pSVar8 = (StackSym *)pOVar2[1]._vptr_Opnd;
      if ((pSVar8->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_0046f012;
        *puVar9 = 0;
      }
      AVar7 = StackSym::GetArgSlotNum(pSVar8);
      ppIVar10 = (Instr **)(ulong)(AVar7 - 1);
      if (AVar7 - 1 == *callback.argIndex) {
        *callback.defInstr = pIVar12;
        ppIVar10 = callback.defInstr;
        break;
      }
    }
    pIVar12 = pIVar11;
  } while (pIVar11 != (Instr *)0x0);
  return SUB81(ppIVar10,0);
}

Assistant:

bool IterateArgInstrs(Fn callback)
    {
        StackSym* linkSym = this->GetSrc2()->GetStackSym();
        Assert(linkSym->IsSingleDef());
        IR::Instr *argInstr = linkSym->m_instrDef;
        IR::Instr* nextArg = nullptr;
        do
        {
            // Get the next instr before calling 'callback' since callback might modify the IR.
            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
            {
                linkSym = argInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
                Assert(linkSym->IsArgSlotSym());

                // Due to dead code elimination in FGPeeps, it is possible for the definitions of the
                // the instructions that we are visiting during FG to have been freed. In this case,
                // the ArgSlot, even though its was a single def, will report IsSingleDef() as false
                // since instrDef is reset to nullptr when the def instr is freed
                Assert(linkSym->IsSingleDef() ||
                    (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)));
                nextArg = linkSym->GetInstrDef();
            }
            else
            {
                nextArg = nullptr;
            }
            if(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)
            {
                argInstr = nextArg;
                // This is a fake ArgOut, skip it
                continue;
            }
            if (argInstr->m_opcode == Js::OpCode::StartCall)
            {
                Assert(nextArg == nullptr);
                break;
            }

            if(callback(argInstr))
            {
                return true;
            }
            argInstr = nextArg;
        } while(argInstr && !argInstr->IsInvalidInstr());

        // If an instr in the call sequence is invalid (0xFDFDFDFD), it must have been freed.
        // This is possible if some dead-code-removal/peeps code removed only part of the call sequence, while the whole sequence was dead (TH Bug 594245).
        // We allow this possibility here, while relying on the more involved dead-code-removal to remove the rest of the call sequence.
        // Inserting the opcode InvalidOpCode, with no lowering, here to safeguard against the possibility of a dead part of the call sequence not being removed. The lowerer would assert then.
        if (argInstr && argInstr->IsInvalidInstr())
        {
            this->InsertBefore(Instr::New(Js::OpCode::InvalidOpCode, this->m_func));
        }
        return false;
    }